

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O1

void Vec_StrPush(Vec_Str_t *p,char Entry)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t __size;
  
  uVar1 = p->nCap;
  if (p->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(p->pArray,0x10);
      }
      p->pArray = pcVar3;
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar1 * 2;
      if ((int)__size <= (int)uVar1) goto LAB_00365354;
      if (p->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(__size);
      }
      else {
        pcVar3 = (char *)realloc(p->pArray,__size);
      }
      p->pArray = pcVar3;
    }
    p->nCap = (int)__size;
  }
LAB_00365354:
  iVar2 = p->nSize;
  p->nSize = iVar2 + 1;
  p->pArray[iVar2] = Entry;
  return;
}

Assistant:

static inline void Vec_StrPush( Vec_Str_t * p, char Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_StrGrow( p, 16 );
        else
            Vec_StrGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}